

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::DefineLabels(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  Type pPVar1;
  code *pcVar2;
  ParseNodeStmt *this_00;
  bool bVar3;
  ByteCodeLabel BVar4;
  undefined4 *puVar5;
  Type_conflict node_00;
  Type *ppPVar6;
  ParseNodeStmt *node;
  Iterator iter;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  iter.current = (NodeBase *)funcInfo;
  BVar4 = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
  *(ByteCodeLabel *)&iter.current[0x42].next = BVar4;
  SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)&node,
             (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)(iter.current + 0x3f))
  ;
  while( true ) {
    if (iter.list == (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_00 = node;
    node_00 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)this_00,
                       node_00);
    if (bVar3) break;
    iter.list = (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppPVar6 = SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&node);
    pPVar1 = *ppPVar6;
    BVar4 = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
    pPVar1->breakLabel = BVar4;
    BVar4 = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
    pPVar1->continueLabel = BVar4;
    pPVar1->emitLabels = true;
  }
  return;
}

Assistant:

void ByteCodeGenerator::DefineLabels(FuncInfo *funcInfo)
{
    funcInfo->singleExit = m_writer.DefineLabel();
    SList<ParseNodeStmt *>::Iterator iter(&funcInfo->targetStatements);
    while (iter.Next())
    {
        ParseNodeStmt * node = iter.Data();
        node->breakLabel = m_writer.DefineLabel();
        node->continueLabel = m_writer.DefineLabel();
        node->emitLabels = true;
    }
}